

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_executor.cpp
# Opt level: O2

PipelineExecuteResult __thiscall duckdb::PipelineExecutor::PushFinalize(PipelineExecutor *this)

{
  _Head_base<0UL,_duckdb::LocalSinkState_*,_false> _Var1;
  int iVar2;
  PhysicalOperator *pPVar3;
  reference this_00;
  pointer pOVar4;
  reference pvVar5;
  InternalException *this_01;
  PipelineExecuteResult PVar6;
  idx_t i;
  ulong __n;
  allocator local_51;
  OperatorSinkCombineInput combine_input;
  
  if (this->finalized != true) {
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->sink);
    combine_input.global_state =
         unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
         operator*(&pPVar3->sink_state);
    combine_input.local_state =
         unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::
         operator*(&this->local_sink_state);
    combine_input.interrupt_state = &this->interrupt_state;
    pPVar3 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&this->pipeline->sink);
    iVar2 = (*pPVar3->_vptr_PhysicalOperator[0x1b])(pPVar3,&this->context,&combine_input);
    if ((char)iVar2 == '\x01') {
      PVar6 = INTERRUPTED;
    }
    else {
      this->finalized = true;
      for (__n = 0; __n < (ulong)((long)(this->intermediate_states).
                                        super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->intermediate_states).
                                        super_vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3);
          __n = __n + 1) {
        this_00 = vector<duckdb::unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>,_true>
                  ::get<true>(&this->intermediate_states,__n);
        pOVar4 = unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true>
                 ::operator->(this_00);
        pvVar5 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>
                           (&this->pipeline->operators,__n);
        (*pOVar4->_vptr_OperatorState[2])(pOVar4,pvVar5->_M_data,&this->context);
      }
      Executor::Flush(this->pipeline->executor,&this->thread);
      _Var1._M_head_impl =
           (this->local_sink_state).
           super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
           .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl;
      (this->local_sink_state).
      super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>._M_t.
      super___uniq_ptr_impl<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LocalSinkState_*,_std::default_delete<duckdb::LocalSinkState>_>
      .super__Head_base<0UL,_duckdb::LocalSinkState_*,_false>._M_head_impl = (LocalSinkState *)0x0;
      PVar6 = FINISHED;
      if (_Var1._M_head_impl != (LocalSinkState *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_LocalSinkState + 8))();
        PVar6 = FINISHED;
      }
    }
    return PVar6;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&combine_input,
             "Calling PushFinalize on a pipeline that has been finalized already",&local_51);
  InternalException::InternalException(this_01,(string *)&combine_input);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

PipelineExecuteResult PipelineExecutor::PushFinalize() {
	if (finalized) {
		throw InternalException("Calling PushFinalize on a pipeline that has been finalized already");
	}

	D_ASSERT(local_sink_state);

	// Run the combine for the sink
	OperatorSinkCombineInput combine_input {*pipeline.sink->sink_state, *local_sink_state, interrupt_state};

#ifdef DUCKDB_DEBUG_ASYNC_SINK_SOURCE
	if (debug_blocked_combine_count < debug_blocked_target_count) {
		debug_blocked_combine_count++;

		auto &callback_state = combine_input.interrupt_state;
		std::thread rewake_thread([callback_state] {
			std::this_thread::sleep_for(std::chrono::milliseconds(1));
			callback_state.Callback();
		});
		rewake_thread.detach();

		return PipelineExecuteResult::INTERRUPTED;
	}
#endif
	auto result = pipeline.sink->Combine(context, combine_input);

	if (result == SinkCombineResultType::BLOCKED) {
		return PipelineExecuteResult::INTERRUPTED;
	}

	finalized = true;
	// flush all query profiler info
	for (idx_t i = 0; i < intermediate_states.size(); i++) {
		intermediate_states[i]->Finalize(pipeline.operators[i].get(), context);
	}
	pipeline.executor.Flush(thread);
	local_sink_state.reset();

	return PipelineExecuteResult::FINISHED;
}